

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall
vmips::ArrayAccess::ArrayAccess
          (ArrayAccess *this,shared_ptr<vmips::VirtReg> *target,shared_ptr<vmips::VirtReg> *offset,
          shared_ptr<vmips::MemoryLocation> *location)

{
  shared_ptr<vmips::MemoryLocation> local_48;
  shared_ptr<vmips::VirtReg> local_38;
  shared_ptr<vmips::MemoryLocation> *local_28;
  shared_ptr<vmips::MemoryLocation> *location_local;
  shared_ptr<vmips::VirtReg> *offset_local;
  shared_ptr<vmips::VirtReg> *target_local;
  ArrayAccess *this_local;
  
  local_28 = location;
  location_local = (shared_ptr<vmips::MemoryLocation> *)offset;
  offset_local = target;
  target_local = (shared_ptr<vmips::VirtReg> *)this;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_38,target);
  std::shared_ptr<vmips::MemoryLocation>::shared_ptr(&local_48,location);
  Memory::Memory(&this->super_Memory,&local_38,&local_48);
  std::shared_ptr<vmips::MemoryLocation>::~shared_ptr(&local_48);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_38);
  (this->super_Memory).super_Instruction._vptr_Instruction =
       (_func_int **)&PTR_collect_register_001c11d8;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->offset,offset);
  return;
}

Assistant:

ArrayAccess::ArrayAccess(std::shared_ptr<VirtReg> target, std::shared_ptr<VirtReg> offset,
                         std::shared_ptr<MemoryLocation> location) : Memory(std::move(target), std::move(location)),
                                                                     offset(std::move(offset)) {
}